

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int find_closest_qindex_by_rate
              (int desired_bits_per_mb,AV1_COMP *cpi,double correction_factor,int best_qindex,
              int worst_qindex)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_EDI;
  int prev_bits_per_mb;
  int prev_bit_diff;
  int prev_q;
  int curr_bit_diff;
  int curr_bits_per_mb;
  int curr_q;
  int mid_bits_per_mb;
  int mid;
  int high;
  int low;
  int use_cyclic_refresh;
  int local_58;
  int local_54;
  int local_48;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int iVar2;
  int local_28;
  
  local_28 = in_EDX;
  while (iVar2 = in_ECX, local_28 < iVar2) {
    in_stack_ffffffffffffffd0 = local_28 + iVar2 >> 1;
    in_stack_ffffffffffffffcc =
         get_bits_per_mb((AV1_COMP *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc,
                         (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc);
    in_ECX = in_stack_ffffffffffffffd0;
    if (in_EDI < in_stack_ffffffffffffffcc) {
      local_28 = in_stack_ffffffffffffffd0 + 1;
      in_ECX = iVar2;
    }
  }
  iVar1 = get_bits_per_mb((AV1_COMP *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc,
                          (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
  if (in_EDI < iVar1) {
    local_54 = 0x7fffffff;
  }
  else {
    local_54 = in_EDI - iVar1;
  }
  local_58 = local_28 + -1;
  if ((local_54 == 0x7fffffff) || (local_28 == in_EDX)) {
    local_48 = 0x7fffffff;
  }
  else {
    local_48 = get_bits_per_mb((AV1_COMP *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffcc,(double)CONCAT44(iVar1,local_54),local_58);
    local_48 = local_48 - in_EDI;
  }
  if (local_54 <= local_48) {
    local_58 = local_28;
  }
  return local_58;
}

Assistant:

static int find_closest_qindex_by_rate(int desired_bits_per_mb,
                                       const AV1_COMP *cpi,
                                       double correction_factor,
                                       int best_qindex, int worst_qindex) {
  const int use_cyclic_refresh = cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
                                 cpi->cyclic_refresh->apply_cyclic_refresh;

  // Find 'qindex' based on 'desired_bits_per_mb'.
  assert(best_qindex <= worst_qindex);
  int low = best_qindex;
  int high = worst_qindex;
  while (low < high) {
    const int mid = (low + high) >> 1;
    const int mid_bits_per_mb =
        get_bits_per_mb(cpi, use_cyclic_refresh, correction_factor, mid);
    if (mid_bits_per_mb > desired_bits_per_mb) {
      low = mid + 1;
    } else {
      high = mid;
    }
  }
  assert(low == high);

  // Calculate rate difference of this q index from the desired rate.
  const int curr_q = low;
  const int curr_bits_per_mb =
      get_bits_per_mb(cpi, use_cyclic_refresh, correction_factor, curr_q);
  const int curr_bit_diff = (curr_bits_per_mb <= desired_bits_per_mb)
                                ? desired_bits_per_mb - curr_bits_per_mb
                                : INT_MAX;
  assert((curr_bit_diff != INT_MAX && curr_bit_diff >= 0) ||
         curr_q == worst_qindex);

  // Calculate rate difference for previous q index too.
  const int prev_q = curr_q - 1;
  int prev_bit_diff;
  if (curr_bit_diff == INT_MAX || curr_q == best_qindex) {
    prev_bit_diff = INT_MAX;
  } else {
    const int prev_bits_per_mb =
        get_bits_per_mb(cpi, use_cyclic_refresh, correction_factor, prev_q);
    assert(prev_bits_per_mb > desired_bits_per_mb);
    prev_bit_diff = prev_bits_per_mb - desired_bits_per_mb;
  }

  // Pick one of the two q indices, depending on which one has rate closer to
  // the desired rate.
  return (curr_bit_diff <= prev_bit_diff) ? curr_q : prev_q;
}